

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O2

void __thiscall
randomx::BytecodeMachine::compileProgram
          (BytecodeMachine *this,Program *program,InstructionByteCode *bytecode,
          NativeRegisterFile *regFile)

{
  uint i;
  long lVar1;
  Instruction *instr;
  
  beginCompilation(this,regFile);
  instr = program->programBuffer;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    compileInstruction(this,instr,(int)lVar1,bytecode);
    instr = instr + 1;
    bytecode = bytecode + 1;
  }
  return;
}

Assistant:

void compileProgram(Program& program, InstructionByteCode bytecode[RANDOMX_PROGRAM_SIZE], NativeRegisterFile& regFile) {
			beginCompilation(regFile);
			for (unsigned i = 0; i < RANDOMX_PROGRAM_SIZE; ++i) {
				auto& instr = program(i);
				auto& ibc = bytecode[i];
				compileInstruction(instr, i, ibc);
			}
		}